

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O3

QByteArray * QTzTimeZonePrivate::staticSystemTimeZoneId(void)

{
  storage_type_conflict *psVar1;
  QArrayData *pQVar2;
  char *pcVar3;
  char16_t *pcVar4;
  undefined1 *puVar5;
  Data *pDVar6;
  Data *data_00;
  Data *pDVar7;
  bool bVar8;
  int iVar9;
  long *plVar10;
  int *piVar11;
  long lVar12;
  qsizetype qVar13;
  ulong uVar14;
  undefined1 *puVar15;
  QArrayData *pQVar16;
  QArrayData *pQVar17;
  char *pcVar18;
  char *pcVar19;
  Data *pDVar20;
  long lVar21;
  QByteArray *in_RDI;
  char *pcVar22;
  QArrayData *pQVar23;
  long in_FS_OFFSET;
  QLatin1StringView str;
  QStringView string;
  QStringView string_00;
  stat64 data;
  QByteArray local_128;
  QString local_108;
  QString local_e8;
  stat64 local_c8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  qgetenv(in_RDI,"TZ");
  local_c8.st_dev = 0x59c32a;
  bVar8 = ::operator==(in_RDI,(char **)&local_c8);
  if (bVar8) {
    QByteArray::clear(in_RDI);
LAB_003f9f6c:
    if ((in_RDI->d).size != 0) goto LAB_003fa454;
  }
  else {
    lVar21 = (in_RDI->d).size;
    if (lVar21 != 0) {
      pcVar19 = (in_RDI->d).ptr;
      if (*pcVar19 == ':') {
        QByteArray::QByteArray((QByteArray *)&local_c8,pcVar19 + 1,lVar21 + -1);
        pQVar16 = &((in_RDI->d).d)->super_QArrayData;
        pcVar19 = (in_RDI->d).ptr;
        (in_RDI->d).d = (Data *)local_c8.st_dev;
        (in_RDI->d).ptr = (char *)local_c8.st_ino;
        puVar15 = (undefined1 *)(in_RDI->d).size;
        (in_RDI->d).size = local_c8.st_nlink;
        local_c8.st_dev = (__dev_t)pQVar16;
        local_c8.st_ino = (__ino64_t)pcVar19;
        local_c8.st_nlink = (__nlink_t)puVar15;
        if (pQVar16 != (QArrayData *)0x0) {
          LOCK();
          (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
               (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pQVar16->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(pQVar16,1,0x10);
          }
        }
      }
      goto LAB_003f9f6c;
    }
  }
  plVar10 = (long *)__tls_get_addr(&PTR_006a9338);
  if (*(char *)((long)plVar10 + 0x99) == '\0') {
    staticSystemTimeZoneId();
  }
  memset(&local_c8,0xaa,0x90);
  iVar9 = stat64("/etc/localtime",&local_c8);
  pQVar16 = (QArrayData *)0xffffffffffffffff;
  pcVar19 = (char *)0xffffffffffffffff;
  if (iVar9 != -1) {
    pQVar16 = (QArrayData *)local_c8.st_dev;
    pcVar19 = (char *)local_c8.st_ino;
  }
  memset(&local_c8,0xaa,0x90);
  iVar9 = stat64("/etc/TZ",&local_c8);
  pQVar17 = (QArrayData *)0xffffffffffffffff;
  pcVar18 = (char *)0xffffffffffffffff;
  if (iVar9 != -1) {
    pQVar17 = (QArrayData *)local_c8.st_dev;
    pcVar18 = (char *)local_c8.st_ino;
  }
  memset(&local_c8,0xaa,0x90);
  iVar9 = stat64("/etc/timezone",&local_c8);
  pcVar22 = (char *)0xffffffffffffffff;
  pQVar23 = (QArrayData *)0xffffffffffffffff;
  if (iVar9 != -1) {
    pcVar22 = (char *)local_c8.st_ino;
    pQVar23 = (QArrayData *)local_c8.st_dev;
  }
  puVar15 = (undefined1 *)plVar10[2];
  if (puVar15 == (undefined1 *)0x0) {
LAB_003fa0fc:
    local_c8.st_nlink = (__nlink_t)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.st_dev = (__dev_t)&DAT_aaaaaaaaaaaaaaaa;
    local_c8.st_ino = (__ino64_t)&DAT_aaaaaaaaaaaaaaaa;
    qEnvironmentVariable((QString *)&local_c8,"TZDIR");
    local_e8.d.d = (Data *)0x0;
    local_e8.d.ptr = L"/etc/localtime";
    local_e8.d.size = 0xe;
    piVar11 = __errno_location();
    *piVar11 = 0;
    lVar12 = sysconf(0xad);
    lVar21 = 0x14;
    if (-1 < lVar12) {
      lVar21 = lVar12;
    }
    do {
      QFile::symLinkTarget(&local_108,&local_e8);
      pcVar4 = local_e8.d.ptr;
      data_00 = local_e8.d.d;
      qVar13 = local_108.d.size;
      pDVar6 = local_108.d.d;
      local_108.d.d = local_e8.d.d;
      local_e8.d.d = pDVar6;
      local_e8.d.ptr = local_108.d.ptr;
      local_108.d.ptr = pcVar4;
      local_108.d.size = local_e8.d.size;
      local_e8.d.size = qVar13;
      if (&data_00->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (data_00->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (data_00->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((data_00->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&data_00->super_QArrayData,2,0x10);
        }
      }
      if ((undefined1 *)local_c8.st_nlink != (undefined1 *)0x0) {
        qVar13 = QString::indexOf(&local_e8,(QString *)&local_c8,0,CaseSensitive);
        if (-1 < (int)(uint)qVar13) {
          local_108.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_108.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_108.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          string_00.m_size =
               local_e8.d.ptr + (long)(local_c8.st_nlink + ((uint)qVar13 & 0x7fffffff));
          string_00.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
          QtPrivate::convertToUtf8
                    ((QByteArray *)&local_108,
                     (QtPrivate *)
                     (local_e8.d.size + -(long)(local_c8.st_nlink + ((uint)qVar13 & 0x7fffffff))),
                     string_00);
          if (((undefined1 *)local_108.d.size == (undefined1 *)0x0) ||
             ((char)*local_108.d.ptr != '/')) {
            local_128.d.d = (Data *)local_108.d.d;
            local_128.d.ptr = (char *)local_108.d.ptr;
            local_128.d.size = local_108.d.size;
            if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
              LOCK();
              ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                   ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                   1;
              UNLOCK();
            }
          }
          else {
            QByteArray::QByteArray
                      (&local_128,(char *)((long)local_108.d.ptr + 1),
                       (qsizetype)(local_108.d.size + -1));
          }
          if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
               ) {
              QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,1,0x10);
            }
          }
          goto LAB_003fa27f;
        }
      }
      str.m_data = "/zoneinfo/";
      str.m_size = 10;
      qVar13 = QString::indexOf(&local_e8,str,0,CaseSensitive);
      if (-1 < (int)(uint)qVar13) {
        uVar14 = (ulong)((uint)qVar13 & 0x7fffffff);
        psVar1 = (storage_type_conflict *)(uVar14 + 10);
        string.m_size = local_e8.d.ptr + uVar14 + 10;
        string.m_data = psVar1;
        QtPrivate::convertToUtf8(&local_128,(QtPrivate *)(local_e8.d.size + -(long)psVar1),string);
        goto LAB_003fa27f;
      }
    } while (((undefined1 *)local_e8.d.size != (undefined1 *)0x0) &&
            (bVar8 = 1 < lVar21, lVar21 = lVar21 + -1, bVar8));
    local_128.d.d = (Data *)0x0;
    local_128.d.ptr = (char *)0x0;
    local_128.d.size = 0;
LAB_003fa27f:
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_c8.st_dev != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_c8.st_dev)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_c8.st_dev)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_c8.st_dev)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_c8.st_dev,2,0x10);
      }
    }
    pQVar2 = (QArrayData *)*plVar10;
    pcVar4 = (char16_t *)plVar10[1];
    *plVar10 = (long)local_128.d.d;
    plVar10[1] = (long)local_128.d.ptr;
    puVar5 = (undefined1 *)plVar10[2];
    plVar10[2] = local_128.d.size;
    puVar15 = (undefined1 *)local_128.d.size;
    local_128.d.d = (Data *)pQVar2;
    local_128.d.ptr = (char *)pcVar4;
    local_128.d.size = (qsizetype)puVar5;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,1,0x10);
      }
      puVar15 = (undefined1 *)plVar10[2];
    }
    if (puVar15 != (undefined1 *)0x0) {
      plVar10[3] = (long)pQVar16;
      pcVar18 = pcVar19;
LAB_003fa408:
      plVar10[4] = (long)pcVar18;
      goto LAB_003fa40c;
    }
    local_e8.d.d = (Data *)0x0;
    local_e8.d.ptr = L"/etc/TZ";
    local_e8.d.size = 7;
    anon_unknown.dwarf_13b371b::ZoneNameReader::etcContent((QByteArray *)&local_c8,&local_e8);
    pQVar16 = (QArrayData *)*plVar10;
    pcVar19 = (char *)plVar10[1];
    *plVar10 = local_c8.st_dev;
    plVar10[1] = local_c8.st_ino;
    puVar15 = (undefined1 *)plVar10[2];
    plVar10[2] = local_c8.st_nlink;
    local_c8.st_dev = (__dev_t)pQVar16;
    local_c8.st_ino = (__ino64_t)pcVar19;
    local_c8.st_nlink = (__nlink_t)puVar15;
    if (pQVar16 != (QArrayData *)0x0) {
      LOCK();
      (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar16->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar16,1,0x10);
      }
    }
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
    puVar15 = (undefined1 *)plVar10[2];
    if (puVar15 != (undefined1 *)0x0) {
      plVar10[3] = (long)pQVar17;
      goto LAB_003fa408;
    }
    local_e8.d.d = (Data *)0x0;
    local_e8.d.ptr = L"/etc/timezone";
    local_e8.d.size = 0xd;
    anon_unknown.dwarf_13b371b::ZoneNameReader::etcContent((QByteArray *)&local_c8,&local_e8);
    pQVar16 = (QArrayData *)*plVar10;
    pcVar19 = (char *)plVar10[1];
    *plVar10 = local_c8.st_dev;
    plVar10[1] = local_c8.st_ino;
    puVar15 = (undefined1 *)plVar10[2];
    plVar10[2] = local_c8.st_nlink;
    local_c8.st_dev = (__dev_t)pQVar16;
    local_c8.st_ino = (__ino64_t)pcVar19;
    local_c8.st_nlink = (__nlink_t)puVar15;
    if (pQVar16 != (QArrayData *)0x0) {
      LOCK();
      (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar16->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar16,1,0x10);
      }
    }
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,2,0x10);
      }
    }
    puVar15 = (undefined1 *)plVar10[2];
    pDVar20 = (Data *)0x0;
    plVar10[3] = (ulong)pQVar23 | -(ulong)(puVar15 == (undefined1 *)0x0);
    plVar10[4] = -(ulong)(puVar15 == (undefined1 *)0x0) | (ulong)pcVar22;
    pcVar19 = (char *)plVar10[1];
    pDVar7 = (Data *)*plVar10;
    if ((Data *)*plVar10 != (Data *)0x0) goto LAB_003fa41e;
  }
  else {
    pQVar2 = (QArrayData *)plVar10[3];
    pcVar3 = (char *)plVar10[4];
    if ((((ulong)pQVar2 & (ulong)pcVar3) == 0xffffffffffffffff) ||
       (((pcVar3 != pcVar19 || pQVar2 != pQVar16 && (pcVar3 != pcVar18 || pQVar2 != pQVar17)) &&
        (pcVar3 != pcVar22 || pQVar2 != pQVar23)))) goto LAB_003fa0fc;
LAB_003fa40c:
    pcVar19 = (char *)plVar10[1];
    pDVar7 = (Data *)*plVar10;
    if ((Data *)*plVar10 == (Data *)0x0) {
      pDVar20 = (Data *)0x0;
    }
    else {
LAB_003fa41e:
      pDVar20 = pDVar7;
      LOCK();
      (pDVar20->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar20->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  pQVar16 = &((in_RDI->d).d)->super_QArrayData;
  (in_RDI->d).d = pDVar20;
  (in_RDI->d).ptr = pcVar19;
  (in_RDI->d).size = (qsizetype)puVar15;
  if (pQVar16 != (QArrayData *)0x0) {
    LOCK();
    (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar16->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar16->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar16,1,0x10);
    }
  }
LAB_003fa454:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QByteArray QTzTimeZonePrivate::staticSystemTimeZoneId()
{
    // Check TZ env var first, if not populated try find it
    QByteArray ianaId = qgetenv("TZ");

    // The TZ value can be ":/etc/localtime" which libc considers
    // to be a "default timezone", in which case it will be read
    // by one of the blocks below, so unset it here so it is not
    // considered as a valid/found ianaId
    if (ianaId == ":/etc/localtime")
        ianaId.clear();
    else if (ianaId.startsWith(':'))
        ianaId = ianaId.sliced(1);

    if (ianaId.isEmpty()) {
        Q_CONSTINIT thread_local static ZoneNameReader reader;
        ianaId = reader.name();
    }

    return ianaId;
}